

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  ImVector<ImGuiOldColumnData> *this;
  float fVar1;
  ImGuiWindow *window;
  ImGuiOldColumnData *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiID id;
  ImGuiOldColumns *pIVar5;
  int iVar6;
  ImGuiContext *g;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImGuiOldColumnData column;
  
  pIVar4 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  window = pIVar4->CurrentWindow;
  id = GetColumnsID(str_id,columns_count);
  pIVar5 = FindOrCreateColumns(window,id);
  pIVar5->Current = 0;
  pIVar5->Count = columns_count;
  pIVar5->Flags = flags;
  (window->DC).CurrentColumns = pIVar5;
  pIVar5->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar5->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar3 = (window->ClipRect).Max;
  (pIVar5->HostInitialClipRect).Min = (window->ClipRect).Min;
  (pIVar5->HostInitialClipRect).Max = IVar3;
  IVar3 = (window->ParentWorkRect).Max;
  (pIVar5->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
  (pIVar5->HostBackupParentWorkRect).Max = IVar3;
  IVar3 = (window->WorkRect).Max;
  (window->ParentWorkRect).Min = (window->WorkRect).Min;
  (window->ParentWorkRect).Max = IVar3;
  fVar1 = (pIVar4->Style).ItemSpacing.x;
  fVar11 = (window->WindowPadding).x;
  fVar13 = fVar1 - fVar11;
  fVar11 = fVar11 * 0.5;
  uVar10 = -(uint)(window->WindowBorderSize <= fVar11);
  fVar12 = (window->WorkRect).Max.x;
  fVar13 = (float)(-(uint)(0.0 <= fVar13) & (uint)fVar13);
  fVar14 = (fVar1 + fVar12) - fVar13;
  fVar12 = (float)(int)(float)(~uVar10 & (uint)window->WindowBorderSize | (uint)fVar11 & uVar10) +
           fVar12;
  if (fVar12 <= fVar14) {
    fVar14 = fVar12;
  }
  fVar13 = ((window->DC).Indent.x - fVar1) + fVar13;
  pIVar5->OffMinX = fVar13;
  fVar14 = fVar14 - (window->Pos).x;
  fVar13 = fVar13 + 1.0;
  uVar10 = -(uint)(fVar13 <= fVar14);
  pIVar5->OffMaxX = (float)(~uVar10 & (uint)fVar13 | (uint)fVar14 & uVar10);
  fVar11 = (window->DC).CursorPos.y;
  pIVar5->LineMaxY = fVar11;
  pIVar5->LineMinY = fVar11;
  this = &pIVar5->Columns;
  iVar6 = (pIVar5->Columns).Size;
  if (iVar6 != columns_count + 1 && iVar6 != 0) {
    ImVector<ImGuiOldColumnData>::resize(this,0);
    iVar6 = this->Size;
  }
  pIVar5->IsFirstFrame = iVar6 == 0;
  if (iVar6 == 0) {
    ImVector<ImGuiOldColumnData>::reserve(this,columns_count + 1);
    for (iVar6 = 0; iVar6 <= columns_count; iVar6 = iVar6 + 1) {
      column.ClipRect.Max.x = 0.0;
      column.ClipRect.Max.y = 0.0;
      column.OffsetNormBeforeResize = 0.0;
      column.Flags = 0;
      column.ClipRect.Min.x = 0.0;
      column.ClipRect.Min.y = 0.0;
      column.OffsetNorm = (float)iVar6 / (float)columns_count;
      ImVector<ImGuiOldColumnData>::push_back(this,&column);
    }
  }
  uVar8 = 0;
  uVar9 = (ulong)(uint)columns_count;
  if (columns_count < 1) {
    uVar9 = uVar8;
  }
  lVar7 = 0xc;
  while (uVar9 != uVar8) {
    pIVar2 = (pIVar5->Columns).Data;
    fVar11 = (window->Pos).x;
    fVar12 = GetColumnOffset((int)uVar8);
    uVar8 = uVar8 + 1;
    fVar14 = GetColumnOffset((int)uVar8);
    *(float *)((long)&pIVar2->OffsetNorm + lVar7) = (float)(int)(fVar12 + fVar11 + 0.5);
    *(undefined4 *)((long)&pIVar2->OffsetNormBeforeResize + lVar7) = 0xff7fffff;
    *(float *)((long)&pIVar2->Flags + lVar7) = (float)(int)(fVar14 + fVar11 + -1.0 + 0.5);
    *(undefined4 *)((long)&(pIVar2->ClipRect).Min.x + lVar7) = 0x7f7fffff;
    ImRect::ClipWithFull((ImRect *)((long)&pIVar2->OffsetNorm + lVar7),&window->ClipRect);
    lVar7 = lVar7 + 0x1c;
  }
  if (1 < pIVar5->Count) {
    ImDrawListSplitter::Split(&pIVar5->Splitter,window->DrawList,pIVar5->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&pIVar5->Splitter,window->DrawList,1);
    PushColumnClipRect(0);
  }
  iVar6 = pIVar5->Current;
  fVar11 = GetColumnOffset(iVar6);
  fVar12 = GetColumnOffset(iVar6 + 1);
  PushItemWidth((fVar12 - fVar11) * 0.65);
  fVar14 = fVar1 - (window->WindowPadding).x;
  fVar14 = (float)(-(uint)(0.0 <= fVar14) & (uint)fVar14);
  (window->DC).ColumnsOffset.x = fVar14;
  fVar11 = (window->Pos).x;
  (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar11 + fVar14);
  (window->WorkRect).Max.x = (fVar12 + fVar11) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}